

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::http_connection::start
          (http_connection *this,string *hostname,int port,time_duration timeout,proxy_settings *ps,
          bool ssl,int handle_redirects,optional<libtorrent::aux::bind_info_t> *bind_addr,
          resolver_flags resolve_flags,i2p_connection *i2p_conn)

{
  _Atomic_word *p_Var1;
  byte bVar2;
  pointer pcVar3;
  pointer pbVar4;
  io_context *piVar5;
  resolver_interface *prVar6;
  proxy_type_t pVar7;
  undefined1 uVar8;
  uint16_t uVar9;
  element_type *peVar10;
  string *psVar11;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__polymorphic_socket_hpp:53:5),_const_std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_&>
  _Var12;
  int iVar13;
  char *pcVar14;
  size_t sVar15;
  socklen_t __len;
  context *ssl_context;
  sockaddr *__addr;
  proxy_type_t *ppVar17;
  proxy_settings *ppVar18;
  address *__args;
  undefined7 in_register_00000089;
  undefined4 uVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar20;
  bool bVar21;
  error_code ec;
  error_code err;
  proxy_settings i2p_proxy;
  proxy_settings null_proxy;
  error_code ignore;
  element_type *local_348;
  element_type *local_340;
  proxy_settings *local_338;
  io_context *local_330;
  string *local_328;
  undefined4 local_31c;
  proxy_type_t *local_318;
  undefined1 local_310 [4];
  uint uStack_30c;
  element_type *peStack_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  optional<libtorrent::aux::bind_info_t> *local_2f0;
  undefined1 local_2e8 [16];
  pointer local_2d8;
  pointer pcStack_2d0;
  code *local_2c8;
  io_context *piStack_2c0;
  undefined1 local_2b0 [24];
  _Alloc_hider local_298;
  undefined1 local_290 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  proxy_type_t local_230 [8];
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined8 local_208;
  element_type *peStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  string local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [19];
  undefined1 local_a8 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined4 local_40;
  undefined1 local_3c;
  system_error_category *local_38;
  proxy_settings *ppVar16;
  
  local_338 = (proxy_settings *)CONCAT44(local_338._4_4_,(int)CONCAT71(in_register_00000089,ssl));
  this->m_redirects = handle_redirects;
  (this->m_resolve_flags).m_val = resolve_flags.m_val;
  ppVar17 = &ps->type;
  if (ps != (proxy_settings *)0x0) {
    ::std::__cxx11::string::_M_assign((string *)&this->m_proxy);
    ::std::__cxx11::string::_M_assign((string *)&(this->m_proxy).username);
    ::std::__cxx11::string::_M_assign((string *)&(this->m_proxy).password);
    pVar7 = ps->type;
    uVar8 = ps->field_0x61;
    uVar9 = ps->port;
    *(undefined4 *)((long)&(this->m_proxy).port + 1) = *(undefined4 *)((long)&ps->port + 1);
    (this->m_proxy).type = pVar7;
    (this->m_proxy).field_0x61 = uVar8;
    (this->m_proxy).port = uVar9;
  }
  ::std::__shared_ptr<libtorrent::aux::http_connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::http_connection,void>
            ((__shared_ptr<libtorrent::aux::http_connection,(__gnu_cxx::_Lock_policy)2> *)&local_348
             ,(__weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2> *)
              &this->super_enable_shared_from_this<libtorrent::aux::http_connection>);
  (this->m_completion_timeout).__r = timeout.__r;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_after(&this->m_timer,&this->m_completion_timeout);
  if (local_340 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)
               ((long)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                       _M_weak_this.
                       super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 4);
      *p_Var1 = *p_Var1 + 1;
      UNLOCK();
    }
    else {
      p_Var1 = (_Atomic_word *)
               ((long)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                       _M_weak_this.
                       super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 4);
      *p_Var1 = *p_Var1 + 1;
    }
  }
  local_228._0_8_ = on_timeout;
  local_228._8_8_ = local_348;
  local_218._M_allocated_capacity = (size_type)local_340;
  boost::asio::detail::
  deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
  ::
  async_wait<std::_Bind<void(*(std::weak_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(std::weak_ptr<libtorrent::aux::http_connection>,boost::system::error_code_const&)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
            ((deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
              *)(this->m_timer).impl_.service_,&(this->m_timer).impl_.implementation_,
             (_Bind<void_(*(std::weak_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(std::weak_ptr<libtorrent::aux::http_connection>,_const_boost::system::error_code_&)>
              *)local_228,&(this->m_timer).impl_.executor_);
  if ((element_type *)local_218._M_allocated_capacity != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(local_218._M_allocated_capacity + 0xc);
      iVar13 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar13 = *(_Atomic_word *)(local_218._M_allocated_capacity + 0xc);
      *(int *)(local_218._M_allocated_capacity + 0xc) = iVar13 + -1;
    }
    if (iVar13 == 1) {
      (**(code **)(*(long *)local_218._M_allocated_capacity + 0x18))();
    }
  }
  this->m_called = false;
  http_parser::reset(&this->m_parser);
  pcVar3 = (this->m_recvbuffer).super_vector<char,_std::allocator<char>_>.
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_recvbuffer).super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish !=
      pcVar3) {
    (this->m_recvbuffer).super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         pcVar3;
  }
  this->m_read_pos = 0;
  local_330 = (io_context *)&this->m_sock;
  if (((this->m_sock).
       super__Optional_base<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>,_true,_false,_false>
       .
       super__Optional_payload_base<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_>
       ._M_engaged == true) &&
     (_Var12 = ::std::
               visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___tream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>const&>
                         ((anon_class_1_0_00000001 *)local_228,
                          (variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                           *)local_330), _Var12)) {
    sVar15 = (this->m_hostname)._M_string_length;
    if (sVar15 == hostname->_M_string_length) {
      if (sVar15 == 0) {
        bVar20 = true;
      }
      else {
        iVar13 = bcmp((this->m_hostname)._M_dataplus._M_p,(hostname->_M_dataplus)._M_p,sVar15);
        bVar20 = iVar13 == 0;
      }
    }
    else {
      bVar20 = false;
    }
    if (((bVar20) && ((uint)this->m_port == port)) && (this->m_ssl == (bool)(char)local_338)) {
      bVar20 = (this->m_bind_addr).super__Optional_base<libtorrent::aux::bind_info_t,_false,_false>.
               _M_payload.super__Optional_payload<libtorrent::aux::bind_info_t,_true,_false,_false>.
               super__Optional_payload_base<libtorrent::aux::bind_info_t>._M_engaged;
      bVar21 = bVar20 == (bind_addr->
                         super__Optional_base<libtorrent::aux::bind_info_t,_false,_false>).
                         _M_payload.
                         super__Optional_payload<libtorrent::aux::bind_info_t,_true,_false,_false>.
                         super__Optional_payload_base<libtorrent::aux::bind_info_t>._M_engaged;
      if ((bVar20 & bVar21) == 1) {
        bVar21 = bind_info_t::operator==((bind_info_t *)&this->m_bind_addr,(bind_info_t *)bind_addr)
        ;
      }
      if (bVar21 != false) {
        local_290._8_8_ = (this->m_sendbuffer)._M_string_length;
        local_290._0_8_ = local_290._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          local_290._0_8_ = (this->m_sendbuffer)._M_dataplus._M_p;
        }
        local_228._0_8_ = on_write;
        local_228._8_8_ = (element_type *)0x0;
        local_218._M_allocated_capacity = (size_type)local_348;
        local_218._8_8_ = local_340;
        if (local_340 != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                     _M_weak_this.
                     super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(local_340->
                          super_enable_shared_from_this<libtorrent::aux::http_connection>).
                          _M_weak_this.
                          super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 1;
            UNLOCK();
          }
          else {
            *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                     _M_weak_this.
                     super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(local_340->
                          super_enable_shared_from_this<libtorrent::aux::http_connection>).
                          _M_weak_this.
                          super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 1;
          }
        }
        local_a8._0_8_ = local_330;
        boost::asio::detail::
        initiate_async_write_buffer_sequence<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>>
        ::operator()((initiate_async_write_buffer_sequence<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>>
                      *)local_a8,
                     (_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                      *)local_228,(mutable_buffer *)local_290,
                     (transfer_all_t *)local_300._M_local_buf);
        if ((element_type *)local_218._8_8_ != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
        }
        goto LAB_001c9c3b;
      }
    }
  }
  this->m_ssl = SUB81(local_338,0);
  local_2f0 = &this->m_bind_addr;
  ::std::_Optional_payload_base<libtorrent::aux::bind_info_t>::_M_copy_assign
            ((_Optional_payload_base<libtorrent::aux::bind_info_t> *)local_2f0,
             (_Optional_payload_base<libtorrent::aux::bind_info_t> *)bind_addr);
  local_2e8._0_4_ = 0;
  local_2e8[4] = '\0';
  local_2e8._8_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
  if (((this->m_sock).
       super__Optional_base<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>,_true,_false,_false>
       .
       super__Optional_payload_base<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_>
       ._M_engaged == true) &&
     (_Var12 = ::std::
               visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___tream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>const&>
                         ((anon_class_1_0_00000001 *)local_228,
                          (variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                           *)local_330), _Var12)) {
    local_228._0_8_ = local_2e8;
    ::std::
    visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
              ((anon_class_8_1_3fcf655c *)local_228,
               (variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                *)local_330);
  }
  pcVar14 = strrchr((hostname->_M_dataplus)._M_p,0x2e);
  proxy_settings::proxy_settings((proxy_settings *)local_290);
  local_328 = hostname;
  local_318 = ppVar17;
  ppVar16 = ps;
  if (pcVar14 == (char *)0x0) {
LAB_001c95ba:
    uVar19 = 0;
LAB_001c95bd:
    if (ppVar16 == (proxy_settings *)0x0) {
      ppVar18 = (proxy_settings *)0x0;
    }
    else {
      ppVar18 = (proxy_settings *)0x0;
      if ((char)local_338 != '\0') {
        ppVar18 = ppVar16;
      }
      if ((*ppVar17 & ~socks4) != http) {
        ppVar18 = ppVar16;
      }
    }
    proxy_settings::proxy_settings((proxy_settings *)local_a8);
    ssl_context = (context *)0x0;
    if (this->m_ssl != false) {
      ssl_context = this->m_ssl_ctx;
    }
    ppVar16 = (proxy_settings *)local_a8;
    if (ppVar18 != (proxy_settings *)0x0) {
      ppVar16 = ppVar18;
    }
    local_338 = ps;
    local_31c = uVar19;
    instantiate_connection
              ((socket_type *)local_228,this->m_ios,ppVar16,ssl_context,(utp_socket_manager *)0x0,
               false,false);
    piVar5 = local_330;
    ::std::
    optional<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>>
    ::
    emplace<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>>
              ((optional<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>>
                *)local_330,
               (polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                *)local_228);
    ::std::__detail::__variant::
    _Variant_storage<false,_libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
    ::~_Variant_storage((_Variant_storage<false,_libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                         *)local_228);
    if ((this->m_bind_addr).super__Optional_base<libtorrent::aux::bind_info_t,_false,_false>.
        _M_payload.super__Optional_payload<libtorrent::aux::bind_info_t,_true,_false,_false>.
        super__Optional_payload_base<libtorrent::aux::bind_info_t>._M_engaged == true) {
      local_310 = (undefined1  [4])0x0;
      uStack_30c = uStack_30c & 0xffffff00;
      peStack_308 = (element_type *)
                    &boost::system::detail::cat_holder<void>::system_category_instance;
      local_300._M_allocated_capacity._0_4_ =
           (uint)((this->m_bind_addr).
                  super__Optional_base<libtorrent::aux::bind_info_t,_false,_false>._M_payload.
                  super__Optional_payload<libtorrent::aux::bind_info_t,_true,_false,_false>.
                  super__Optional_payload_base<libtorrent::aux::bind_info_t>._M_payload._M_value.ip.
                  type_ != ipv4) * 8 + 2;
      local_228._0_8_ = &local_300;
      local_228._8_8_ = (element_type *)local_310;
      ::std::
      visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
                ((anon_class_16_2_7fa27225 *)local_228,
                 (variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                  *)piVar5);
      local_228._8_8_ = &stack0xffffffffffffffc0;
      local_40 = 0;
      local_3c = '\0';
      local_38 = &boost::system::detail::cat_holder<void>::system_category_instance;
      local_300._M_allocated_capacity =
           (size_type)
           (local_2f0->super__Optional_base<libtorrent::aux::bind_info_t,_false,_false>)._M_payload.
           super__Optional_payload<libtorrent::aux::bind_info_t,_true,_false,_false>.
           super__Optional_payload_base<libtorrent::aux::bind_info_t>._M_payload._M_value.device.
           _M_dataplus;
      local_228._0_8_ = &local_300;
      ::std::
      visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
                ((anon_class_16_2_c962e082 *)local_228,
                 (variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                  *)piVar5);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                ((basic_endpoint<boost::asio::ip::tcp> *)local_228,
                 &(this->m_bind_addr).
                  super__Optional_base<libtorrent::aux::bind_info_t,_false,_false>._M_payload.
                  super__Optional_payload<libtorrent::aux::bind_info_t,_true,_false,_false>.
                  super__Optional_payload_base<libtorrent::aux::bind_info_t>._M_payload._M_value.ip,
                 0);
      local_300._M_allocated_capacity =
           (size_type)(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228;
      local_300._8_8_ = (element_type *)local_310;
      ::std::
      visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
                ((anon_class_16_2_e6882782 *)&local_300,
                 (variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                  *)piVar5);
      if (uStack_30c._0_1_ != true) goto LAB_001c97a3;
      local_300._M_allocated_capacity = (size_type)this->m_ios;
      local_218._M_allocated_capacity = 0;
      local_218._8_8_ = (element_type *)0x0;
      local_228._0_8_ = callback;
      local_228._8_8_ = (element_type *)0x0;
      local_208._4_4_ = uStack_30c;
      local_208._0_4_ = local_310;
      peStack_200 = peStack_308;
      local_1f8._M_allocated_capacity = (size_type)local_348;
      local_1f8._8_8_ = local_340;
      if (local_340 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                   _M_weak_this.
                   super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>)
                        ._M_weak_this.
                        super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                   _M_weak_this.
                   super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>)
                        ._M_weak_this.
                        super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 1;
        }
      }
      local_300._12_4_ = 1;
      boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
      execute<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,boost::system::error_code,libtorrent::span<char>))(boost::system::error_code,libtorrent::span<char>)>>
                ((basic_executor_type<std::allocator<void>,0u> *)local_300._M_local_buf,
                 (_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_boost::system::error_code,_libtorrent::span<char>))(boost::system::error_code,_libtorrent::span<char>)>
                  *)local_228);
LAB_001c9a4b:
      if ((element_type *)local_1f8._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
      }
    }
    else {
LAB_001c97a3:
      ppVar17 = local_318;
      psVar11 = local_328;
      local_310 = (undefined1  [4])0x0;
      uStack_30c = uStack_30c & 0xffffff00;
      peStack_308 = (element_type *)
                    &boost::system::detail::cat_holder<void>::system_category_instance;
      setup_ssl_hostname((socket_type *)piVar5,local_328,(error_code *)local_310);
      peVar10 = local_340;
      if (uStack_30c._0_1_ == true) {
        local_300._M_allocated_capacity = (size_type)this->m_ios;
        local_218._M_allocated_capacity = 0;
        local_218._8_8_ = (element_type *)0x0;
        local_228._0_8_ = callback;
        local_228._8_8_ = (element_type *)0x0;
        local_208._4_4_ = uStack_30c;
        local_208._0_4_ = local_310;
        peStack_200 = peStack_308;
        local_1f8._M_allocated_capacity = (size_type)local_348;
        local_1f8._8_8_ = local_340;
        if (local_340 != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                     _M_weak_this.
                     super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(local_340->
                          super_enable_shared_from_this<libtorrent::aux::http_connection>).
                          _M_weak_this.
                          super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 1;
            UNLOCK();
          }
          else {
            *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                     _M_weak_this.
                     super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(local_340->
                          super_enable_shared_from_this<libtorrent::aux::http_connection>).
                          _M_weak_this.
                          super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 1;
          }
        }
        local_300._12_4_ = 1;
        boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
        execute<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,boost::system::error_code,libtorrent::span<char>))(boost::system::error_code,libtorrent::span<char>)>>
                  ((basic_executor_type<std::allocator<void>,0u> *)local_300._M_local_buf,
                   (_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_boost::system::error_code,_libtorrent::span<char>))(boost::system::error_code,_libtorrent::span<char>)>
                    *)local_228);
        goto LAB_001c9a4b;
      }
      pbVar4 = (this->m_endpoints).
               super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               .
               super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_endpoints).
          super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          .
          super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pbVar4) {
        (this->m_endpoints).
        super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
        .
        super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
      }
      this->m_next_ep = 0;
      if ((char)local_31c == '\0') {
        if (((local_338 == (proxy_settings *)0x0) || (local_338->proxy_hostnames != true)) ||
           ((*ppVar17 & ~socks4) != socks5)) {
          this->m_resolving_host = true;
          prVar6 = this->m_resolver;
          bVar2 = (this->m_resolve_flags).m_val;
          if (local_340 != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                       _M_weak_this.
                       super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr =
                   *(int *)&(local_340->
                            super_enable_shared_from_this<libtorrent::aux::http_connection>).
                            _M_weak_this.
                            super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 1;
              UNLOCK();
            }
            else {
              *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                       _M_weak_this.
                       super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr =
                   *(int *)&(local_340->
                            super_enable_shared_from_this<libtorrent::aux::http_connection>).
                            _M_weak_this.
                            super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 1;
            }
          }
          local_2c8 = (code *)0x0;
          piStack_2c0 = (io_context *)0x0;
          local_2d8 = (pointer)0x0;
          pcStack_2d0 = (pointer)0x0;
          local_2d8 = (pointer)operator_new(0x20);
          *(code **)local_2d8 = on_resolve;
          local_2d8[8] = '\0';
          local_2d8[9] = '\0';
          local_2d8[10] = '\0';
          local_2d8[0xb] = '\0';
          local_2d8[0xc] = '\0';
          local_2d8[0xd] = '\0';
          local_2d8[0xe] = '\0';
          local_2d8[0xf] = '\0';
          *(element_type **)(local_2d8 + 0x10) = local_348;
          *(element_type **)(local_2d8 + 0x18) = peVar10;
          piStack_2c0 = (io_context *)
                        ::std::
                        _Function_handler<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&),_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
                        ::_M_invoke;
          local_2c8 = ::std::
                      _Function_handler<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&),_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
                      ::_M_manager;
          (**prVar6->_vptr_resolver_interface)(prVar6,local_328,(ulong)bVar2);
          if (local_2c8 != (code *)0x0) {
            (*local_2c8)(&local_2d8,&local_2d8,3);
          }
        }
        else {
          ppVar16 = local_338;
          ::std::__cxx11::string::_M_assign((string *)&this->m_hostname);
          __len = (socklen_t)ppVar16;
          this->m_port = (uint16_t)port;
          __args = (address *)local_228;
          local_218._M_allocated_capacity = 0;
          local_218._8_8_ = (element_type *)0x0;
          local_228._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_228._8_8_ = (element_type *)0x0;
          ::std::
          vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
          ::emplace_back<boost::asio::ip::address,unsigned_short&>
                    ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                      *)&this->m_endpoints,__args,&this->m_port);
          connect(this,(int)__args,__addr,__len);
        }
      }
      else {
        pcVar14 = (psVar11->_M_dataplus)._M_p;
        if (psVar11->_M_string_length < 0x204) {
          local_2b0._0_8_ = on_i2p_resolve;
          local_2b0._8_8_ = 0;
          local_2b0._16_8_ = local_348;
          local_298._M_p = (pointer)local_340;
          if (local_340 != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                       _M_weak_this.
                       super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr =
                   *(int *)&(local_340->
                            super_enable_shared_from_this<libtorrent::aux::http_connection>).
                            _M_weak_this.
                            super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 1;
              UNLOCK();
            }
            else {
              *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                       _M_weak_this.
                       super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr =
                   *(int *)&(local_340->
                            super_enable_shared_from_this<libtorrent::aux::http_connection>).
                            _M_weak_this.
                            super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 1;
            }
          }
          i2p_connection::
          async_name_lookup<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,char_const*)>>
                    (i2p_conn,pcVar14,
                     (_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_char_*)>
                      *)local_2b0);
          if ((element_type *)local_298._M_p != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_p);
          }
        }
        else {
          connect_i2p_tracker(this,pcVar14);
        }
      }
      ::std::__cxx11::string::_M_assign((string *)&this->m_hostname);
      this->m_port = (uint16_t)port;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_allocated_capacity != &local_58) {
      operator_delete((void *)local_68._M_allocated_capacity,local_58._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._32_8_ != &local_78) {
      operator_delete((void *)local_a8._32_8_,local_78._M_allocated_capacity + 1);
    }
    if ((io_context *)local_a8._0_8_ != (io_context *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
  }
  else {
    sVar15 = strlen(pcVar14);
    if (sVar15 == 4) {
      iVar13 = bcmp(pcVar14,".i2p",4);
      bVar20 = iVar13 == 0;
    }
    else {
      bVar20 = false;
    }
    uVar19 = 0;
    if (i2p_conn == (i2p_connection *)0x0) goto LAB_001c95ba;
    if (!bVar20) goto LAB_001c95bd;
    this->m_i2p_conn = i2p_conn;
    (this->m_completion_timeout).__r = (this->m_completion_timeout).__r << 2;
    i2p_connection::proxy((proxy_settings *)local_228,i2p_conn);
    uVar8 = local_1d8[1]._0_1_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._0_8_ != local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208 != &local_1f8) {
      operator_delete((void *)local_208,(ulong)(local_1f8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != &local_218) {
      operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_allocated_capacity + 1));
    }
    if (uVar8 == i2p_proxy) {
      i2p_connection::proxy((proxy_settings *)local_228,i2p_conn);
      ppVar17 = local_230;
      ::std::__cxx11::string::operator=((string *)local_290,(string *)local_228);
      ::std::__cxx11::string::operator=((string *)&local_270,(string *)&local_208);
      ::std::__cxx11::string::operator=((string *)&local_250,local_1e8);
      local_230._1_2_ = local_1d8[1]._1_2_;
      local_230[0] = local_1d8[1]._0_1_;
      local_230[3] = local_1d8[1]._3_1_;
      local_230._4_3_ = (undefined3)((uint)local_1d8[1]._3_4_ >> 8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._0_8_ != local_1d8) {
        operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208 != &local_1f8) {
        operator_delete((void *)local_208,(ulong)(local_1f8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._0_8_ != &local_218) {
        operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_allocated_capacity + 1));
      }
      uVar19 = (undefined4)CONCAT71((uint7)(uint3)((uint)port >> 8),1);
      ppVar16 = (proxy_settings *)local_290;
      goto LAB_001c95bd;
    }
    piVar5 = this->m_ios;
    _local_208 = (undefined1  [16])errors::make_error_code(no_i2p_router);
    local_218._M_allocated_capacity = 0;
    local_218._8_8_ = (element_type *)0x0;
    local_228._0_8_ = callback;
    local_228._8_8_ = (element_type *)0x0;
    local_1f8._M_allocated_capacity = (size_type)local_348;
    local_1f8._8_8_ = local_340;
    if (local_340 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                 _M_weak_this.
                 super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                      _M_weak_this.
                      super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                 _M_weak_this.
                 super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(local_340->super_enable_shared_from_this<libtorrent::aux::http_connection>).
                      _M_weak_this.
                      super___weak_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 1;
      }
    }
    local_a8._12_4_ = 1;
    local_a8._0_8_ = piVar5;
    boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
    execute<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,boost::system::error_code,libtorrent::span<char>))(boost::system::error_code,libtorrent::span<char>)>>
              ((basic_executor_type<std::allocator<void>,0u> *)local_a8,
               (_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_boost::system::error_code,_libtorrent::span<char>))(boost::system::error_code,_libtorrent::span<char>)>
                *)local_228);
    if ((element_type *)local_1f8._8_8_ != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_p != &local_240) {
    operator_delete(local_250._M_p,local_240._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_p != &local_260) {
    operator_delete(local_270._M_p,local_260._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._0_8_ != &local_280) {
    operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
  }
LAB_001c9c3b:
  if (local_340 != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_340);
  }
  return;
}

Assistant:

void http_connection::start(std::string const& hostname, int port
	, time_duration timeout, aux::proxy_settings const* ps, bool ssl
	, int handle_redirects
	, std::optional<bind_info_t> const& bind_addr
	, aux::resolver_flags const resolve_flags
#if TORRENT_USE_I2P
	, i2p_connection* i2p_conn
#endif
	)
{
	m_redirects = handle_redirects;
	m_resolve_flags = resolve_flags;
	if (ps) m_proxy = *ps;

	// keep ourselves alive even if the callback function
	// deletes this object
	std::shared_ptr<http_connection> me(shared_from_this());

	m_completion_timeout = timeout;
	m_timer.expires_after(m_completion_timeout);
	ADD_OUTSTANDING_ASYNC("http_connection::on_timeout");
	m_timer.async_wait(std::bind(&http_connection::on_timeout
		, std::weak_ptr<http_connection>(me), _1));
	m_called = false;
	m_parser.reset();
	m_recvbuffer.clear();
	m_read_pos = 0;

#if TORRENT_USE_SSL
	TORRENT_ASSERT(!ssl || m_ssl_ctx != nullptr);
#endif

	if (m_sock && m_sock->is_open() && m_hostname == hostname && m_port == port
		&& m_ssl == ssl && m_bind_addr == bind_addr)
	{
		ADD_OUTSTANDING_ASYNC("http_connection::on_write");
		async_write(*m_sock, boost::asio::buffer(m_sendbuffer)
			, std::bind(&http_connection::on_write, me, _1));
	}
	else
	{
		m_ssl = ssl;
		m_bind_addr = bind_addr;
		error_code err;
		if (m_sock && m_sock->is_open()) m_sock->close(err);

		aux::proxy_settings const* proxy = ps;

#if TORRENT_USE_I2P
		bool is_i2p = false;
		char const* top_domain = strrchr(hostname.c_str(), '.');
		aux::proxy_settings i2p_proxy;
		if (top_domain && top_domain == ".i2p"_sv && i2p_conn)
		{
			// this is an i2p name, we need to use the sam connection
			// to do the name lookup
			is_i2p = true;
			m_i2p_conn = i2p_conn;
			// quadruple the timeout for i2p destinations
			// because i2p is sloooooow
			m_completion_timeout *= 4;

			if (i2p_conn->proxy().type != settings_pack::i2p_proxy)
			{
				post(m_ios, std::bind(&http_connection::callback
					, me, error_code(errors::no_i2p_router), span<char>{}));
				return;
			}

			i2p_proxy = i2p_conn->proxy();
			proxy = &i2p_proxy;
		}
#endif

		// in this case, the upper layer is assumed to have taken
		// care of the proxying already. Don't instantiate the socket
		// with this proxy
		if (proxy && (proxy->type == settings_pack::http
			|| proxy->type == settings_pack::http_pw)
			&& !ssl)
		{
			proxy = nullptr;
		}
		aux::proxy_settings null_proxy;

		void* userdata = nullptr;
#if TORRENT_USE_SSL
		if (m_ssl)
		{
			TORRENT_ASSERT(m_ssl_ctx != nullptr);
			userdata = m_ssl_ctx;
		}
#endif
		// assume this is not a tracker connection. Tracker connections that
		// shouldn't be subject to the proxy should pass in nullptr as the proxy
		// pointer.
		m_sock.emplace(instantiate_connection(m_ios
			, proxy ? *proxy : null_proxy, userdata, nullptr, false, false));

		if (m_bind_addr)
		{
			error_code ec;
			m_sock->open(m_bind_addr->ip.is_v4() ? tcp::v4() : tcp::v6(), ec);
#if TORRENT_HAS_BINDTODEVICE
			error_code ignore;
			bind_device(*m_sock, m_bind_addr->device.c_str(), ignore);
#endif
			m_sock->bind(tcp::endpoint(m_bind_addr->ip, 0), ec);
			if (ec)
			{
				post(m_ios, std::bind(&http_connection::callback
					, me, ec, span<char>{}));
				return;
			}
		}

		error_code ec;
		setup_ssl_hostname(*m_sock, hostname, ec);
		if (ec)
		{
			post(m_ios, std::bind(&http_connection::callback
				, me, ec, span<char>{}));
			return;
		}

		m_endpoints.clear();
		m_next_ep = 0;

#if TORRENT_USE_I2P
		if (is_i2p)
		{
			if (hostname.length() < 516) // Base64 encoded  destination with optional .i2p
			{
				ADD_OUTSTANDING_ASYNC("http_connection::on_i2p_resolve");
				i2p_conn->async_name_lookup(hostname.c_str(), std::bind(&http_connection::on_i2p_resolve
					, me, _1, _2));
			}
			else
				connect_i2p_tracker(hostname.c_str());
		}
		else
#endif
		if (ps && ps->proxy_hostnames
			&& (ps->type == settings_pack::socks5
				|| ps->type == settings_pack::socks5_pw))
		{
			m_hostname = hostname;
			m_port = std::uint16_t(port);
			m_endpoints.emplace_back(address(), m_port);
			connect();
		}
		else
		{
			m_resolving_host = true;
			ADD_OUTSTANDING_ASYNC("http_connection::on_resolve");
			m_resolver.async_resolve(hostname, m_resolve_flags
				, std::bind(&http_connection::on_resolve
				, me, _1, _2));
		}
		m_hostname = hostname;
		m_port = std::uint16_t(port);
	}
}